

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

bool __thiscall Assembler::isDirective(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)line);
  bVar1 = checkIfSection(this,&local_40);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_60,(string *)line);
    bVar1 = checkIfEnd(this,&local_60);
    bVar2 = true;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_80,(string *)line);
      bVar1 = checkIfEqu(this,&local_80);
      bVar2 = true;
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_a0,(string *)line);
        bVar1 = checkIfExtern(this,&local_a0);
        bVar2 = true;
        if (!bVar1) {
          std::__cxx11::string::string((string *)&local_c0,(string *)line);
          bVar1 = checkIfGlobal(this,&local_c0);
          bVar2 = true;
          if (!bVar1) {
            std::__cxx11::string::string((string *)&local_e0,(string *)line);
            bVar1 = checkIfSkip(this,&local_e0);
            bVar2 = true;
            if (!bVar1) {
              std::__cxx11::string::string((string *)&local_100,(string *)line);
              bVar1 = checkIfWord(this,&local_100);
              bVar2 = true;
              if (!bVar1) {
                std::__cxx11::string::string((string *)&local_120,(string *)line);
                bVar2 = checkIfLabel(this,&local_120);
                std::__cxx11::string::~string((string *)&local_120);
              }
              std::__cxx11::string::~string((string *)&local_100);
            }
            std::__cxx11::string::~string((string *)&local_e0);
          }
          std::__cxx11::string::~string((string *)&local_c0);
        }
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar2;
}

Assistant:

bool Assembler::isDirective(string line) {
    if (checkIfSection(line) || checkIfEnd(line) || checkIfEqu(line) || checkIfExtern(line)
        || checkIfGlobal(line) || checkIfSkip(line) || checkIfWord(line)
        || checkIfLabel(line))
        return true;
    else return false;
}